

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenSIMDReplace(BinaryenModuleRef module,BinaryenOp op,BinaryenExpressionRef vec,uint8_t index,
                   BinaryenExpressionRef value)

{
  SIMDReplace *pSVar1;
  Builder local_38;
  Expression *local_30;
  BinaryenExpressionRef value_local;
  BinaryenExpressionRef pEStack_20;
  uint8_t index_local;
  BinaryenExpressionRef vec_local;
  BinaryenModuleRef pMStack_10;
  BinaryenOp op_local;
  BinaryenModuleRef module_local;
  
  local_30 = value;
  value_local._7_1_ = index;
  pEStack_20 = vec;
  vec_local._4_4_ = op;
  pMStack_10 = module;
  wasm::Builder::Builder(&local_38,module);
  pSVar1 = wasm::Builder::makeSIMDReplace
                     (&local_38,vec_local._4_4_,pEStack_20,value_local._7_1_,local_30);
  return (BinaryenExpressionRef)pSVar1;
}

Assistant:

BinaryenExpressionRef BinaryenSIMDReplace(BinaryenModuleRef module,
                                          BinaryenOp op,
                                          BinaryenExpressionRef vec,
                                          uint8_t index,
                                          BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeSIMDReplace(
        SIMDReplaceOp(op), (Expression*)vec, index, (Expression*)value));
}